

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmatrix.h
# Opt level: O2

SMatrix<double,_3,_3> * __thiscall
gmath::DMatrix::operator_cast_to_SMatrix
          (SMatrix<double,_3,_3> *__return_storage_ptr__,DMatrix *this)

{
  long lVar1;
  int k;
  long lVar2;
  double (*padVar3) [3];
  long lVar4;
  
  SMatrix<double,_3,_3>::SMatrix(__return_storage_ptr__);
  lVar1 = *(long *)(this + 0x10);
  padVar3 = (double (*) [3])__return_storage_ptr__;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      (*(double (*) [3])*padVar3)[lVar4] = *(double *)(lVar1 + lVar4 * 8);
    }
    lVar1 = lVar1 + 0x18;
    padVar3 = padVar3 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

operator SMatrix<S, r, c>() const
    {
      SMatrix<S, r, c> ret;

      assert(nrows == r);
      assert(ncols == c);

      for (int k=0; k<r; k++)
        for (int i=0; i<c; i++)
        {
          ret(k, i)=static_cast<S>(v[k*c+i]);
        }

      return ret;
    }